

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowNthValueExecutor::EvaluateInternal
          (WindowNthValueExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  WindowExecutorLocalState *pWVar1;
  WindowExcludeMode WVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  _func_int *p_Var5;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> _Var6;
  WindowCollection *r;
  WindowExecutor *mask;
  type this_00;
  const_reference pvVar7;
  reference pvVar8;
  ulong uVar9;
  reference pvVar10;
  _func_int *p_Var11;
  pointer this_01;
  idx_t row_idx_00;
  ulong uVar12;
  iterator __begin3;
  WindowCursor *pWVar13;
  size_type __n;
  ulong target_offset;
  iterator __end3;
  ulong uVar14;
  pair<unsigned_long,_unsigned_long> pVar15;
  SubFrames *__range3;
  WindowInputExpression nth_col;
  _func_int *local_80;
  WindowInputExpression local_78;
  WindowExecutor *local_60;
  idx_t local_58;
  data_ptr_t local_50;
  data_ptr_t local_48;
  data_ptr_t local_40;
  data_ptr_t local_38;
  
  this_00 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
            operator*(&lstate[0x15].range_cursor);
  pWVar1 = lstate + 2;
  optional_ptr<duckdb::ValidityMask,_true>::CheckValid
            ((optional_ptr<duckdb::ValidityMask,_true> *)&gstate[2].executor);
  local_60 = gstate[2].executor;
  WVar2 = gstate->executor->wexpr->exclude_clause;
  WindowInputExpression::WindowInputExpression
            (&local_78,eval_chunk,(this->super_WindowValueExecutor).nth_idx);
  pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar1,6);
  local_38 = pvVar7->data;
  pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar1,7);
  local_40 = pvVar7->data;
  pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar1,2);
  local_50 = pvVar7->data;
  pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar1,3);
  if (count != 0) {
    pWVar1 = lstate + 0x14;
    local_48 = pvVar7->data;
    target_offset = 0;
    local_58 = count;
    do {
      uVar12 = *(ulong *)(local_38 + target_offset * 8);
      uVar3 = *(ulong *)(local_40 + target_offset * 8);
      if (WVar2 == NO_OTHER) {
        __n = 0;
      }
      else {
        uVar9 = row_idx;
        if (WVar2 != CURRENT_ROW) {
          uVar9 = *(ulong *)(local_50 + target_offset * 8);
        }
        if (uVar3 <= uVar9) {
          uVar9 = uVar3;
        }
        if (uVar9 <= uVar12) {
          uVar9 = uVar12;
        }
        pvVar8 = vector<duckdb::FrameBounds,_true>::operator[]
                           ((vector<duckdb::FrameBounds,_true> *)pWVar1,0);
        pvVar8->start = uVar12;
        pvVar8->end = uVar9;
        if (WVar2 == TIES) {
          uVar9 = uVar12;
          if (uVar12 < row_idx) {
            uVar9 = row_idx;
          }
          if (uVar3 <= uVar9) {
            uVar9 = uVar3;
          }
          uVar14 = row_idx + 1;
          if (uVar3 <= row_idx + 1) {
            uVar14 = uVar3;
          }
          if (uVar14 <= uVar12) {
            uVar14 = uVar12;
          }
          pvVar8 = vector<duckdb::FrameBounds,_true>::operator[]
                             ((vector<duckdb::FrameBounds,_true> *)pWVar1,1);
          pvVar8->start = uVar9;
          pvVar8->end = uVar14;
          __n = 2;
          count = local_58;
LAB_00cc67c1:
          uVar9 = *(ulong *)(local_48 + target_offset * 8);
        }
        else {
          __n = 1;
          if (WVar2 != CURRENT_ROW) goto LAB_00cc67c1;
          uVar9 = row_idx + 1;
        }
        if (uVar12 < uVar9) {
          uVar12 = uVar9;
        }
        if (uVar3 <= uVar12) {
          uVar12 = uVar3;
        }
      }
      pvVar8 = vector<duckdb::FrameBounds,_true>::operator[]
                         ((vector<duckdb::FrameBounds,_true> *)pWVar1,__n);
      pvVar8->start = uVar12;
      pvVar8->end = uVar3;
      pvVar10 = vector<duckdb::Vector,_true>::operator[](&(local_78.chunk)->data,local_78.col_idx);
      puVar4 = (pvVar10->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (local_78.scalar == true) {
        if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) goto LAB_00cc68ce;
LAB_00cc6834:
        pvVar10 = vector<duckdb::Vector,_true>::operator[](&(local_78.chunk)->data,local_78.col_idx)
        ;
        mask = local_60;
        uVar12 = target_offset;
        if (local_78.scalar != false) {
          uVar12 = 0;
        }
        p_Var5 = *(_func_int **)(pvVar10->data + uVar12 * 8);
        if ((long)p_Var5 < 1) goto LAB_00cc68ce;
        pWVar13 = (WindowCursor *)lstate[0x14].super_WindowExecutorState._vptr_WindowExecutorState;
        _Var6._M_head_impl =
             lstate[0x14].range_cursor.
             super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
             .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
        local_80 = p_Var5;
        if (gstate[2].partition_mask == (ValidityMask *)0x0) {
          for (; pWVar13 != _Var6._M_head_impl;
              pWVar13 = (WindowCursor *)((long)&(pWVar13->state).current_chunk_state.handles + 8)) {
            r = (WindowCollection *)(pWVar13->state).current_chunk_state.handles._M_h._M_buckets;
            if ((pWVar13->paged < r) &&
               (row_idx_00 = WindowBoundariesState::FindNextStart
                                       ((ValidityMask *)mask,(idx_t)pWVar13->paged,(idx_t)r,
                                        (idx_t *)&local_80), local_80 == (_func_int *)0x0)) {
              WindowCursor::CopyCell(this_00,0,row_idx_00,result,target_offset);
              goto LAB_00cc692e;
            }
          }
LAB_00cc6917:
          FlatVector::SetNull(result,target_offset,true);
        }
        else {
          if (pWVar13 == _Var6._M_head_impl) goto LAB_00cc6917;
          p_Var11 = (_func_int *)0x0;
          do {
            p_Var11 = p_Var11 + (*(long *)&(pWVar13->state).current_chunk_state.handles._M_h -
                                (long)pWVar13->paged);
            pWVar13 = (WindowCursor *)((long)&(pWVar13->state).current_chunk_state.handles + 8);
          } while (pWVar13 != _Var6._M_head_impl);
          if (p_Var11 <= p_Var5) goto LAB_00cc6917;
          this_01 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                    ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                                  *)&gstate[2].partition_mask);
          pVar15 = WindowIndexTree::SelectNth(this_01,(SubFrames *)pWVar1,(idx_t)(p_Var5 + -1));
          if (pVar15.second != 0) goto LAB_00cc68ce;
          WindowCursor::CopyCell(this_00,0,pVar15.first,result,target_offset);
        }
      }
      else {
        if ((puVar4 == (unsigned_long *)0x0) ||
           ((puVar4[target_offset >> 6] >> (target_offset & 0x3f) & 1) != 0)) goto LAB_00cc6834;
LAB_00cc68ce:
        FlatVector::SetNull(result,target_offset,true);
      }
LAB_00cc692e:
      target_offset = target_offset + 1;
      row_idx = row_idx + 1;
    } while (target_offset != count);
  }
  return;
}

Assistant:

void WindowNthValueExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                              DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &gvstate = gstate.Cast<WindowValueGlobalState>();
	auto &lvstate = lstate.Cast<WindowValueLocalState>();
	auto &cursor = *lvstate.cursor;
	auto &bounds = lvstate.bounds;
	auto &frames = lvstate.frames;
	auto &ignore_nulls = *gvstate.ignore_nulls;
	auto exclude_mode = gvstate.executor.wexpr.exclude_clause;
	D_ASSERT(cursor.chunk.ColumnCount() == 1);
	WindowInputExpression nth_col(eval_chunk, nth_idx);
	WindowAggregator::EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t i) {
		// Returns value evaluated at the row that is the n'th row of the window frame (counting from 1);
		// returns NULL if there is no such row.
		if (nth_col.CellIsNull(i)) {
			FlatVector::SetNull(result, i, true);
			return;
		}
		auto n_param = nth_col.GetCell<int64_t>(i);
		if (n_param < 1) {
			FlatVector::SetNull(result, i, true);
			return;
		}

		//	Decrement as we go along.
		auto n = idx_t(n_param);

		if (gvstate.value_tree) {
			idx_t frame_width = 0;
			for (const auto &frame : frames) {
				frame_width += frame.end - frame.start;
			}

			if (n < frame_width) {
				const auto nth_index = gvstate.value_tree->SelectNth(frames, n - 1);
				if (nth_index.second) {
					// Past end of frame
					FlatVector::SetNull(result, i, true);
				} else {
					cursor.CopyCell(0, nth_index.first, result, i);
				}
			} else {
				FlatVector::SetNull(result, i, true);
			}
			return;
		}

		for (const auto &frame : frames) {
			if (frame.start >= frame.end) {
				continue;
			}

			const auto nth_index = WindowBoundariesState::FindNextStart(ignore_nulls, frame.start, frame.end, n);
			if (!n) {
				cursor.CopyCell(0, nth_index, result, i);
				return;
			}
		}
		FlatVector::SetNull(result, i, true);
	});
}